

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O2

void __thiscall OnDiskIndex::OnDiskIndex(OnDiskIndex *this,string *fname)

{
  RawFile *this_00;
  uint64_t uVar1;
  runtime_error *this_01;
  __off_t in_R8;
  OnDiskIndexHeader header;
  path local_68;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_68,fname);
  std::experimental::filesystem::v1::__cxx11::path::filename((path *)&header,&local_68);
  std::__cxx11::string::string((string *)&this->fname,(string *)&header);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&header);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&this->fpath,fname);
  this_00 = &this->ndxfile;
  RawFile::RawFile(this_00,fname,0,0);
  uVar1 = RawFile::size(this_00);
  this->index_size = uVar1;
  if (uVar1 < 0x8000018) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"corrupted index, file is too small");
  }
  else {
    RawFile::pread(this_00,(int)&header,(void *)0x10,0,in_R8);
    if (header.magic == 0xca7da7a) {
      if (header.version == 6) {
        if (header.raw_type - 1 < 4) {
          if (header.reserved == 0) {
            this->ntype = header.raw_type;
            return;
          }
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"reserved field != 0");
        }
        else {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"invalid index type");
        }
      }
      else {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"unsupported version");
      }
    }
    else {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"invalid magic, not a catdata");
    }
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

OnDiskIndex::OnDiskIndex(const std::string &fname)
    : fname(fs::path(fname).filename()),
      fpath(fs::path(fname)),
      ndxfile(fname) {
    OnDiskIndexHeader header;

    index_size = ndxfile.size();

    if (index_size < DATA_OFFSET + RUN_ARRAY_SIZE) {
        throw std::runtime_error("corrupted index, file is too small");
    }

    ndxfile.pread(&header, sizeof(OnDiskIndexHeader), 0);

    if (header.magic != DB_MAGIC) {
        throw std::runtime_error("invalid magic, not a catdata");
    }

    if (header.version != OnDiskIndex::VERSION) {
        throw std::runtime_error("unsupported version");
    }

    if (!is_valid_index_type(header.raw_type)) {
        throw std::runtime_error("invalid index type");
    }

    if (header.reserved != 0) {
        throw std::runtime_error("reserved field != 0");
    }

    ntype = static_cast<IndexType>(header.raw_type);
}